

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  SQLineInfo *pSVar1;
  SQLocalVarInfo *x;
  SQLocalVarInfo *this_00;
  SQObjectPtr *obj;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQLineInfo *pSVar5;
  longlong *plVar6;
  SQInstruction *__src;
  long in_RDI;
  SQUnsignedInteger nd;
  SQUnsignedInteger ni;
  SQUnsignedInteger nl;
  SQUnsignedInteger no;
  SQUnsignedInteger np;
  SQUnsignedInteger nf;
  SQInteger idx;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr refidx;
  SQFunctionProto *f;
  SQObjectPtr *in_stack_fffffffffffffe70;
  SQFunctionProto *pSVar7;
  SQObjectPtr *in_stack_fffffffffffffe78;
  SQObjectPtr *in_stack_fffffffffffffe80;
  SQInstruction *__dest;
  SQObjectPtr *in_stack_fffffffffffffe88;
  SQInteger in_stack_fffffffffffffe90;
  SQTable *in_stack_fffffffffffffe98;
  SQInteger in_stack_fffffffffffffea0;
  SQInteger in_stack_fffffffffffffea8;
  SQSharedState *in_stack_fffffffffffffeb0;
  SQInteger in_stack_fffffffffffffec0;
  SQInteger in_stack_fffffffffffffec8;
  SQInteger in_stack_fffffffffffffed0;
  SQUnsignedInteger local_90;
  SQUnsignedInteger local_88;
  SQUnsignedInteger local_80;
  SQUnsignedInteger local_78;
  SQUnsignedInteger local_70;
  SQUnsignedInteger local_68;
  SQObjectPtr local_58 [2];
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  SQFunctionProto *local_18;
  
  sqvector<SQInstruction>::size((sqvector<SQInstruction> *)(in_RDI + 0xc0));
  sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x90));
  sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x78));
  sqvector<SQOuterVar>::size((sqvector<SQOuterVar> *)(in_RDI + 0xa8));
  x = (SQLocalVarInfo *)sqvector<SQLineInfo>::size((sqvector<SQLineInfo> *)(in_RDI + 0x138));
  this_00 = (SQLocalVarInfo *)
            sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 0xd8));
  obj = (SQObjectPtr *)sqvector<long_long>::size((sqvector<long_long> *)(in_RDI + 0x1a0));
  local_18 = SQFunctionProto::Create
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,(SQInteger)in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90,(SQInteger)in_stack_fffffffffffffe88,
                        in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffed0);
  ::SQObjectPtr::SQObjectPtr(&local_28);
  ::SQObjectPtr::SQObjectPtr(&local_38);
  ::SQObjectPtr::SQObjectPtr(local_58);
  local_18->_stacksize = *(SQInteger *)(in_RDI + 0x38);
  ::SQObjectPtr::operator=(in_stack_fffffffffffffe70,obj);
  local_18->_bgenerator = (bool)(*(byte *)(in_RDI + 0x41) & 1);
  ::SQObjectPtr::operator=(in_stack_fffffffffffffe70,obj);
  while( true ) {
    SVar2 = SQTable::Next(in_stack_fffffffffffffe98,
                          SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0),
                          in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                          in_stack_fffffffffffffe78);
    if (SVar2 == -1) break;
    ::SQObjectPtr::operator=(in_stack_fffffffffffffe70,obj);
    ::SQObjectPtr::operator=(&this_00->_name,(SQInteger)x);
  }
  local_68 = 0;
  while( true ) {
    SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x78));
    if (SVar3 <= local_68) break;
    sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 0x78),local_68);
    ::SQObjectPtr::operator=(in_stack_fffffffffffffe70,obj);
    local_68 = local_68 + 1;
  }
  local_70 = 0;
  while( true ) {
    SVar3 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x90));
    if (SVar3 <= local_70) break;
    sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 0x90),local_70);
    ::SQObjectPtr::operator=(in_stack_fffffffffffffe70,obj);
    local_70 = local_70 + 1;
  }
  local_78 = 0;
  while( true ) {
    SVar3 = sqvector<SQOuterVar>::size((sqvector<SQOuterVar> *)(in_RDI + 0xa8));
    if (SVar3 <= local_78) break;
    sqvector<SQOuterVar>::operator[]((sqvector<SQOuterVar> *)(in_RDI + 0xa8),local_78);
    SQOuterVar::operator=((SQOuterVar *)this_00,(SQOuterVar *)x);
    local_78 = local_78 + 1;
  }
  local_80 = 0;
  while( true ) {
    SVar3 = local_80;
    SVar4 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 0xd8));
    if (SVar4 <= SVar3) break;
    sqvector<SQLocalVarInfo>::operator[]((sqvector<SQLocalVarInfo> *)(in_RDI + 0xd8),local_80);
    SQLocalVarInfo::operator=(this_00,x);
    local_80 = local_80 + 1;
  }
  local_88 = 0;
  while( true ) {
    SVar3 = local_88;
    SVar4 = sqvector<SQLineInfo>::size((sqvector<SQLineInfo> *)(in_RDI + 0x138));
    if (SVar4 <= SVar3) break;
    pSVar5 = sqvector<SQLineInfo>::operator[]((sqvector<SQLineInfo> *)(in_RDI + 0x138),local_88);
    pSVar1 = local_18->_lineinfos;
    pSVar1[local_88]._line = pSVar5->_line;
    pSVar1[local_88]._op = pSVar5->_op;
    local_88 = local_88 + 1;
  }
  local_90 = 0;
  while( true ) {
    SVar3 = local_90;
    SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI + 0x1a0));
    if (SVar4 <= SVar3) break;
    plVar6 = sqvector<long_long>::operator[]((sqvector<long_long> *)(in_RDI + 0x1a0),local_90);
    local_18->_defaultparams[local_90] = *plVar6;
    local_90 = local_90 + 1;
  }
  __dest = local_18->_instructions;
  __src = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)(in_RDI + 0xc0),0);
  SVar3 = sqvector<SQInstruction>::size((sqvector<SQInstruction> *)(in_RDI + 0xc0));
  memcpy(__dest,__src,SVar3 << 3);
  local_18->_varparams = (ulong)(*(byte *)(in_RDI + 0x40) & 1);
  pSVar7 = local_18;
  ::SQObjectPtr::~SQObjectPtr(&this_00->_name);
  ::SQObjectPtr::~SQObjectPtr(&this_00->_name);
  ::SQObjectPtr::~SQObjectPtr(&this_00->_name);
  return pSVar7;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{

    SQFunctionProto *f=SQFunctionProto::Create(_ss,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}